

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O3

SerialArena *
google::protobuf::internal::ArenaImpl::SerialArena::New(Block *b,void *owner,ArenaImpl *arena)

{
  b->pos_ = 0x60;
  b[1].next_ = (Block *)arena;
  b[1].pos_ = (size_t)owner;
  b[1].size_ = (size_t)b;
  b[2].size_ = (size_t)(b + 4);
  b[3].next_ = (Block *)((long)&b->next_ + b->size_);
  b[2].next_ = (Block *)0x0;
  b[3].pos_ = 0;
  b[3].size_ = 0;
  return (SerialArena *)(b + 1);
}

Assistant:

char* Pointer(size_t n) {
      GOOGLE_DCHECK(n <= size_);
      return reinterpret_cast<char*>(this) + n;
    }